

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::LoadScalarVar
          (InterfaceVariableScalarReplacement *this,Instruction *scalar_var,
          uint32_t *extra_array_index,Instruction *insert_before)

{
  int iVar1;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar2;
  undefined4 extraout_var;
  Instruction *pIVar3;
  Array *array_type;
  TypeManager *ty_mgr;
  Instruction *ptr;
  uint32_t component_type_id;
  Instruction *insert_before_local;
  uint32_t *extra_array_index_local;
  Instruction *scalar_var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  ptr._4_4_ = GetPointeeTypeIdOfVar(this,scalar_var);
  ty_mgr = (TypeManager *)scalar_var;
  if (extra_array_index != (uint32_t *)0x0) {
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(this_00);
    pTVar2 = analysis::TypeManager::GetType(this_01,ptr._4_4_);
    iVar1 = (*pTVar2->_vptr_Type[0x17])();
    if ((Array *)CONCAT44(extraout_var,iVar1) == (Array *)0x0) {
      __assert_fail("array_type != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                    ,0x27a,
                    "Instruction *spvtools::opt::InterfaceVariableScalarReplacement::LoadScalarVar(Instruction *, const uint32_t *, Instruction *)"
                   );
    }
    pTVar2 = analysis::Array::element_type((Array *)CONCAT44(extraout_var,iVar1));
    ptr._4_4_ = analysis::TypeManager::GetTypeInstruction(this_01,pTVar2);
    ty_mgr = (TypeManager *)
             CreateAccessChainWithIndex(this,ptr._4_4_,scalar_var,*extra_array_index,insert_before);
  }
  pIVar3 = CreateLoad(this,ptr._4_4_,(Instruction *)ty_mgr,insert_before);
  return pIVar3;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::LoadScalarVar(
    Instruction* scalar_var, const uint32_t* extra_array_index,
    Instruction* insert_before) {
  uint32_t component_type_id = GetPointeeTypeIdOfVar(scalar_var);
  Instruction* ptr = scalar_var;
  if (extra_array_index) {
    auto* ty_mgr = context()->get_type_mgr();
    analysis::Array* array_type = ty_mgr->GetType(component_type_id)->AsArray();
    assert(array_type != nullptr);
    component_type_id = ty_mgr->GetTypeInstruction(array_type->element_type());
    ptr = CreateAccessChainWithIndex(component_type_id, scalar_var,
                                     *extra_array_index, insert_before);
  }

  return CreateLoad(component_type_id, ptr, insert_before);
}